

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cpp
# Opt level: O3

void __thiscall bitboards::printStandardArrayBoard(bitboards *this)

{
  char *array_00;
  int y;
  int iVar1;
  long lVar2;
  char array [64];
  char local_69;
  char local_68 [64];
  
  array_00 = local_68;
  builtin_strncpy(local_68 + 0x30,"                ",0x10);
  builtin_strncpy(local_68 + 0x20,"                ",0x10);
  builtin_strncpy(local_68 + 0x10,"                ",0x10);
  builtin_strncpy(local_68,"                ",0x10);
  convertToStandardArray(this,array_00);
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      local_69 = array_00[lVar2];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar1 = iVar1 + 1;
    array_00 = array_00 + 8;
  } while (iVar1 != 8);
  return;
}

Assistant:

void bitboards::printStandardArrayBoard() {
  char array[64];
  for (int i=0; i < 64; i++) {
    array[i] = ' ';
  }

  convertToStandardArray(array);

  int i = 0;
  for(int y = 0; y < 8; y++) {
    for(int x = 0; x < 8; x++, i++) {
      std::cout << array[i];
    }
    std::cout << std::endl;
  }
}